

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexCut.c
# Opt level: O0

Gia_Man_t *
Bmc_GiaGenerateGiaOne(Gia_Man_t *p,Abc_Cex_t *pCex,Vec_Bit_t **pvInits,int iFrBeg,int iFrEnd)

{
  Gia_Man_t *p_00;
  Abc_Cex_t *pAVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Vec_Bit_t *pVVar5;
  Gia_Man_t *p_01;
  char *pcVar6;
  bool bVar7;
  int Literal;
  int Counter;
  int Cube;
  int k;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  Vec_Bit_t *vJustis;
  Vec_Bit_t *vValues;
  int iFrEnd_local;
  int iFrBeg_local;
  Vec_Bit_t **pvInits_local;
  Abc_Cex_t *pCex_local;
  Gia_Man_t *p_local;
  
  Literal = 1;
  vValues._0_4_ = iFrEnd;
  vValues._4_4_ = iFrBeg;
  _iFrEnd_local = pvInits;
  pvInits_local = (Vec_Bit_t **)pCex;
  pCex_local = (Abc_Cex_t *)p;
  Bmc_GiaGenerateJust(p,pCex,&vJustis,(Vec_Bit_t **)&pNew);
  iVar2 = Gia_ManRegNum((Gia_Man_t *)pCex_local);
  pVVar5 = Vec_BitStart(iVar2);
  *_iFrEnd_local = pVVar5;
  Counter = 0;
  while( true ) {
    iVar2 = Gia_ManRegNum((Gia_Man_t *)pCex_local);
    pAVar1 = pCex_local;
    bVar7 = false;
    if (Counter < iVar2) {
      iVar2 = Gia_ManPiNum((Gia_Man_t *)pCex_local);
      _Cube = Gia_ManCi((Gia_Man_t *)pAVar1,iVar2 + Counter);
      bVar7 = _Cube != (Gia_Obj_t *)0x0;
    }
    pVVar5 = vJustis;
    if (!bVar7) break;
    iVar2 = Gia_ManObjNum((Gia_Man_t *)pCex_local);
    iVar2 = iVar2 * vValues._4_4_;
    iVar3 = Gia_ObjId((Gia_Man_t *)pCex_local,_Cube);
    iVar2 = Vec_BitEntry(pVVar5,iVar2 + iVar3);
    if (iVar2 != 0) {
      Vec_BitWriteEntry(*_iFrEnd_local,Counter,1);
    }
    Counter = Counter + 1;
  }
  iVar2 = Gia_ManRegNum((Gia_Man_t *)pCex_local);
  p_01 = Gia_ManStart(iVar2 * 2 + 2);
  pcVar6 = Abc_UtilStrsav(*(char **)pCex_local);
  p_01->pName = pcVar6;
  Counter = 0;
  while( true ) {
    iVar2 = Gia_ManRegNum((Gia_Man_t *)pCex_local);
    pAVar1 = pCex_local;
    bVar7 = false;
    if (Counter < iVar2) {
      iVar2 = Gia_ManPiNum((Gia_Man_t *)pCex_local);
      _Cube = Gia_ManCi((Gia_Man_t *)pAVar1,iVar2 + Counter);
      bVar7 = _Cube != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    iVar2 = Gia_ManAppendCi(p_01);
    p_00 = pNew;
    iVar3 = Gia_ManObjNum((Gia_Man_t *)pCex_local);
    iVar3 = iVar3 * (int)vValues;
    iVar4 = Gia_ObjId((Gia_Man_t *)pCex_local,_Cube);
    iVar3 = Vec_BitEntry((Vec_Bit_t *)p_00,iVar3 + iVar4);
    pVVar5 = vJustis;
    if (iVar3 != 0) {
      iVar3 = Gia_ManObjNum((Gia_Man_t *)pCex_local);
      iVar3 = iVar3 * (int)vValues;
      iVar4 = Gia_ObjId((Gia_Man_t *)pCex_local,_Cube);
      iVar3 = Vec_BitEntry(pVVar5,iVar3 + iVar4);
      if (iVar3 == 0) {
        iVar2 = Abc_LitNot(iVar2);
        Literal = Gia_ManAppendAnd(p_01,Literal,iVar2);
      }
      else {
        Literal = Gia_ManAppendAnd(p_01,Literal,iVar2);
      }
    }
    Counter = Counter + 1;
  }
  Gia_ManAppendCo(p_01,Literal);
  Vec_BitFree(vJustis);
  Vec_BitFree((Vec_Bit_t *)pNew);
  return p_01;
}

Assistant:

Gia_Man_t * Bmc_GiaGenerateGiaOne( Gia_Man_t * p, Abc_Cex_t * pCex, Vec_Bit_t ** pvInits, int iFrBeg, int iFrEnd )
{
    Vec_Bit_t * vValues;
    Vec_Bit_t * vJustis;
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int k, Cube = 1, Counter = 0;
    Bmc_GiaGenerateJust( p, pCex, &vValues, &vJustis );
    // collect flop values in frame iFrBeg
    *pvInits = Vec_BitStart( Gia_ManRegNum(p) );
    Gia_ManForEachRo( p, pObj, k )
        if ( Vec_BitEntry(vValues, Gia_ManObjNum(p) * iFrBeg + Gia_ObjId(p, pObj)) )
            Vec_BitWriteEntry( *pvInits, k, 1 );
    // create GIA with justified values in iFrEnd
    pNew = Gia_ManStart( 2 * Gia_ManRegNum(p) + 2 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManForEachRo( p, pObj, k )
    {
        int Literal = Gia_ManAppendCi(pNew);
        if ( !Vec_BitEntry(vJustis, Gia_ManObjNum(p) * iFrEnd + Gia_ObjId(p, pObj)) )
            continue;
        if ( Vec_BitEntry(vValues, Gia_ManObjNum(p) * iFrEnd + Gia_ObjId(p, pObj)) )
            Cube = Gia_ManAppendAnd( pNew, Cube, Literal );
        else
            Cube = Gia_ManAppendAnd( pNew, Cube, Abc_LitNot(Literal) );
        Counter++;
    }
//    printf( "Only %d flops (out of %d) belong to the care set.\n", Counter, Gia_ManRegNum(p) );
    Gia_ManAppendCo( pNew, Cube );
    Vec_BitFree( vValues );
    Vec_BitFree( vJustis );
    return pNew;
}